

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

CharItem ** __thiscall
Hpipe::Vec<Hpipe::CharItem_const*>::push_back<Hpipe::CharItem_const*&>
          (Vec<Hpipe::CharItem_const*> *this,CharItem **args)

{
  std::vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>>::
  emplace_back<Hpipe::CharItem_const*&>
            ((vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>> *)this,args);
  return (CharItem **)(*(long *)(this + 8) + -8);
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }